

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_decoder.h
# Opt level: O1

bool __thiscall
draco::AttributesDecoder::DecodeAttributes(AttributesDecoder *this,DecoderBuffer *in_buffer)

{
  int iVar1;
  
  iVar1 = (*(this->super_AttributesDecoderInterface)._vptr_AttributesDecoderInterface[9])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*(this->super_AttributesDecoderInterface)._vptr_AttributesDecoderInterface[10])
                      (this,in_buffer);
    if ((char)iVar1 != '\0') {
      iVar1 = (*(this->super_AttributesDecoderInterface)._vptr_AttributesDecoderInterface[0xb])
                        (this);
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

bool DecodeAttributes(DecoderBuffer *in_buffer) override {
    if (!DecodePortableAttributes(in_buffer)) {
      return false;
    }
    if (!DecodeDataNeededByPortableTransforms(in_buffer)) {
      return false;
    }
    if (!TransformAttributesToOriginalFormat()) {
      return false;
    }
    return true;
  }